

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O2

void __thiscall
opengv::math::Sturm::findRoots2
          (Sturm *this,vector<double,_std::allocator<double>_> *roots,double eps_x,double eps_val)

{
  MatrixXd *pMVar1;
  _List_node_base *p_Var2;
  ulong uVar3;
  undefined1 auVar4 [16];
  double dVar5;
  bool bVar6;
  bool bVar7;
  Bracket *this_00;
  _List_node_base *p_Var8;
  size_t sVar9;
  _List_node_base *p_Var10;
  double *pdVar11;
  ulong uVar12;
  _Self __tmp;
  undefined1 auVar13 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar14 [16];
  double root;
  Ptr bracket;
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  stack;
  undefined1 local_108 [16];
  variable_if_dynamic<long,__1> local_f8;
  MatrixXd *local_f0;
  variable_if_dynamic<long,__1> local_e8;
  variable_if_dynamic<long,__1> vStack_e0;
  Index local_d8;
  MatrixXd *local_d0;
  undefined1 local_c8 [16];
  size_t *local_b0;
  MatrixXd monomials;
  MatrixXd matValue;
  MatrixXd matDerivative;
  
  local_c8._0_8_ = computeLagrangianBound(this);
  stack.
  super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&stack;
  local_c8._8_8_ = extraout_XMM0_Qb;
  stack.
  super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ._M_impl._M_node._M_size = 0;
  stack.
  super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       stack.
       super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  this_00 = (Bracket *)operator_new(0x30);
  auVar13._8_8_ = 0x8000000000000000;
  auVar13._0_8_ = 0x8000000000000000;
  auVar13 = vxorpd_avx512vl(local_c8,auVar13);
  Bracket::Bracket(this_00,auVar13._0_8_,local_c8._0_8_);
  std::__shared_ptr<opengv::math::Bracket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<opengv::math::Bracket,void>
            ((__shared_ptr<opengv::math::Bracket,(__gnu_cxx::_Lock_policy)2> *)local_108,this_00);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::push_back(&stack,(value_type *)local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
  p_Var2 = stack.
           super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  p_Var8 = (_List_node_base *)evaluateChain2(this,(double)p_Var2->_M_prev);
  p_Var2[2]._M_next = p_Var8;
  *(undefined1 *)&p_Var2[1]._M_prev = 1;
  p_Var2 = stack.
           super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  p_Var8 = (_List_node_base *)evaluateChain2(this,(double)p_Var2[1]._M_next);
  p_Var2[2]._M_prev = p_Var8;
  *(undefined1 *)((long)&p_Var2[1]._M_prev + 1) = 1;
  sVar9 = Bracket::numberRoots
                    ((Bracket *)
                     stack.
                     super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                     ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next);
  std::vector<double,_std::allocator<double>_>::reserve(roots,sVar9);
  local_b0 = &this->_dimension;
  local_108._0_4_ = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&monomials,local_b0,(int *)local_108);
  pMVar1 = &this->_C;
  monomials.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
  [this->_dimension - 1] = 1.0;
  do {
    if (stack.
        super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
        ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&stack) {
      Eigen::internal::handmade_aligned_free
                (monomials.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
      std::__cxx11::
      _List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
      ::_M_clear(&stack.
                  super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                );
      return;
    }
    std::__shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2> *)
               (stack.
                super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                ._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::
    list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
    ::pop_front(&stack);
    bVar7 = Bracket::dividable(bracket.
                               super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,eps_x);
    if (bVar7) {
      sVar9 = Bracket::numberRoots
                        (bracket.
                         super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      if (sVar9 == 1) {
        root = ((bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_lowerBound +
               (bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->_upperBound) * 0.5;
        uVar3 = *local_b0;
        pdVar11 = monomials.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data + (uVar3 - 1);
        for (uVar12 = 2; uVar12 <= uVar3; uVar12 = uVar12 + 1) {
          pdVar11[-1] = *pdVar11 * root;
          pdVar11 = pdVar11 + -1;
        }
        local_108._0_8_ =
             (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
        local_f8.m_value =
             (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
        local_d0 = &monomials;
        local_e8.m_value = 0;
        vStack_e0.m_value = 0;
        local_d8 = 1;
        local_f0 = pMVar1;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&matValue,
                   (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                    *)local_108);
        bVar7 = false;
        local_c8._8_8_ = 0;
        local_c8._0_8_ =
             *matValue.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data;
        do {
          if (bVar7) break;
          local_f8.m_value =
               (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_cols;
          local_108._0_8_ =
               (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data + 1;
          local_e8.m_value = 1;
          vStack_e0.m_value = 0;
          local_d0 = &monomials;
          local_d8 = 1;
          local_f0 = pMVar1;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&matDerivative,
                     (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                      *)local_108);
          dVar5 = root - (double)local_c8._0_8_ /
                         *matDerivative.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_data;
          if ((dVar5 < (bracket.
                        super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->_lowerBound) ||
             ((bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_upperBound < dVar5)) {
LAB_0010db95:
            bVar6 = false;
          }
          else {
            uVar3 = *local_b0;
            pdVar11 = monomials.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data + (uVar3 - 1);
            for (uVar12 = 2; uVar12 <= uVar3; uVar12 = uVar12 + 1) {
              pdVar11[-1] = dVar5 * *pdVar11;
              pdVar11 = pdVar11 + -1;
            }
            local_108._0_8_ =
                 (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
            local_f8.m_value =
                 (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols;
            local_d0 = &monomials;
            local_e8.m_value = 0;
            vStack_e0.m_value = 0;
            local_d8 = 1;
            local_f0 = pMVar1;
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                      (&matValue,
                       (Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                        *)local_108);
            auVar4._8_8_ = 0x7fffffffffffffff;
            auVar4._0_8_ = 0x7fffffffffffffff;
            auVar14._8_8_ = 0;
            auVar14._0_8_ =
                 *matValue.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
            auVar13 = vandpd_avx(auVar14,auVar4);
            auVar4 = vandpd_avx(auVar4,local_c8);
            if (auVar4._0_8_ < auVar13._0_8_) goto LAB_0010db95;
            if (auVar13._0_8_ < eps_val) {
              bVar7 = true;
            }
            bVar6 = true;
            root = dVar5;
            local_c8 = auVar14;
          }
          Eigen::internal::handmade_aligned_free
                    (matDerivative.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
        } while (bVar6);
        if (bVar7) {
          std::vector<double,_std::allocator<double>_>::push_back(roots,&root);
          Eigen::internal::handmade_aligned_free
                    (matValue.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
          goto LAB_0010dc66;
        }
        Eigen::internal::handmade_aligned_free
                  (matValue.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
      }
      Bracket::divide(bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,&stack);
      p_Var8 = stack.
               super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
      p_Var10 = (_List_node_base *)
                evaluateChain2(this,(double)(stack.
                                             super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                                             ._M_impl._M_node.super__List_node_base._M_prev[1].
                                            _M_next)->_M_prev);
      p_Var2 = p_Var8[1]._M_next;
      p_Var2[2]._M_next = p_Var10;
      *(undefined1 *)&p_Var2[1]._M_prev = 1;
      p_Var2 = p_Var8->_M_prev[1]._M_next;
      p_Var2[2]._M_prev = p_Var10;
      *(undefined1 *)((long)&p_Var2[1]._M_prev + 1) = 1;
    }
    else {
      sVar9 = Bracket::numberRoots
                        (bracket.
                         super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      if (sVar9 != 0) {
        local_108._0_8_ =
             ((bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_lowerBound +
             (bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_upperBound) * 0.5;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (roots,(double *)local_108);
      }
    }
LAB_0010dc66:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while( true );
}

Assistant:

void
opengv::math::Sturm::findRoots2( std::vector<double> & roots, double eps_x, double eps_val )
{
  double absoluteBound = computeLagrangianBound();
  std::list<Bracket::Ptr> stack;
  stack.push_back(Bracket::Ptr(new Bracket(-absoluteBound,absoluteBound)));
  stack.back()->setLowerBoundChanges( evaluateChain2(stack.back()->lowerBound()) );
  stack.back()->setUpperBoundChanges( evaluateChain2(stack.back()->upperBound()) );
  roots.reserve(stack.back()->numberRoots());
  
  //some variables for pollishing
  Eigen::MatrixXd monomials(_dimension,1);
  monomials(_dimension-1,0) = 1.0;
  
  while( !stack.empty() )
  {  
    Bracket::Ptr bracket = stack.front();
    stack.pop_front();
    
    if( bracket->dividable(eps_x) )
    {
      bool divide = true;
      
      if( bracket->numberRoots() == 1 )
      {
        //new part, we try immediately to do the pollishing here
        bool converged = false;
        
        double root = 0.5 * (bracket->lowerBound() + bracket->upperBound());
        for(size_t i = 2; i <= _dimension; i++)
          monomials(_dimension-i,0) = monomials(_dimension-i+1,0)*root;
        Eigen::MatrixXd matValue = _C.row(0) * monomials;
        
        double value = matValue(0,0);
        
        while( !converged )
        {
          Eigen::MatrixXd matDerivative = _C.row(1) * monomials;
          double derivative = matDerivative(0,0);
          
          double newRoot = root - (value/derivative);
          
          if( newRoot < bracket->lowerBound() || newRoot > bracket->upperBound() )
            break;
          
          for(size_t i = 2; i <= _dimension; i++)
            monomials(_dimension-i,0) = monomials(_dimension-i+1,0)*newRoot;
          matValue = _C.row(0) * monomials;
          
          double newValue = matValue(0,0);
          
          if( fabs(newValue) > fabs(value) )
            break;
          
          //do update
          value = newValue;
          root = newRoot;
          
          //check if converged
          if( fabs(value) < eps_val )
            converged = true;
        }
        
        if( converged )
        {
          divide = false;
          roots.push_back(root);
        }
      }
      
      if(divide)
      {
        bracket->divide(stack);
        std::list<Bracket::Ptr>::iterator it = stack.end();
        it--;
        size_t changes = evaluateChain2((*it)->lowerBound());
        (*it)->setLowerBoundChanges(changes);
        it--;
        (*it)->setUpperBoundChanges(changes);
      }
    }
    else
    {
      if( bracket->numberRoots() > 0 )
        roots.push_back(0.5 * (bracket->lowerBound() + bracket->upperBound()));
    }
  }
}